

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O2

uint8_t * lws_http_multipart_headers(lws *wsi,uint8_t *p)

{
  char *out;
  undefined1 *puVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  uint8_t *p_local;
  char buf [10];
  char arg [48];
  
  p_local = p;
  sVar3 = lws_get_random((wsi->a).context,buf,10);
  if (sVar3 == 10) {
    out = (wsi->http).multipart_boundary;
    lws_b64_encode_string(buf,10,out,0x10);
    iVar2 = lws_snprintf(arg,0x30,"multipart/form-data; boundary=\"%s\"",out);
    iVar2 = lws_add_http_header_by_token
                      (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,(uchar *)arg,iVar2,&p_local,p + 100);
    puVar4 = (uint8_t *)0x0;
    if (iVar2 == 0) {
      puVar1 = &(wsi->http).field_0x90;
      *puVar1 = *puVar1 | 0x50;
      wsi->field_0x474 = wsi->field_0x474 | 0x10;
      puVar4 = p_local;
    }
  }
  else {
    puVar4 = (uint8_t *)0x0;
  }
  return puVar4;
}

Assistant:

uint8_t *
lws_http_multipart_headers(struct lws *wsi, uint8_t *p)
{
	char buf[10], arg[48];
	int n;

	if (lws_get_random(wsi->a.context, (uint8_t *)buf, sizeof(buf)) !=
			sizeof(buf))
		return NULL;

	lws_b64_encode_string(buf, sizeof(buf),
			       wsi->http.multipart_boundary,
			       sizeof(wsi->http.multipart_boundary));

	n = lws_snprintf(arg, sizeof(arg), "multipart/form-data; boundary=\"%s\"",
			 wsi->http.multipart_boundary);

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
					 (uint8_t *)arg, n, &p, p + 100))
		return NULL;

	wsi->http.multipart = wsi->http.multipart_issue_boundary = 1;
	lws_client_http_body_pending(wsi, 1);

	return p;
}